

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_display_graphic_char(Terminal *term,unsigned_long c)

{
  wchar_t wVar1;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t x;
  wchar_t linecols;
  pos cursplus;
  wchar_t width;
  termline *cline;
  unsigned_long c_local;
  Terminal *term_local;
  
  register0x00000000 = lineptr(term,(term->curs).y,L'ಘ',L'\x01');
  cursplus.y = (wchar_t)((c & 0xfffffc00) == 0xd800);
  if (cursplus.y == L'\0') {
    cursplus.y = term_char_width(term,(uint)c);
  }
  if ((((term->wrapnext & 1U) != 0) && ((term->wrap & 1U) != 0)) && (L'\0' < cursplus.y)) {
    stack0xffffffffffffffe0->lattr = stack0xffffffffffffffe0->lattr | 0x10;
    if ((term->curs).y == term->marg_b) {
      scroll(term,term->marg_t,term->marg_b,L'\x01',true);
    }
    else if ((term->curs).y < term->rows + L'\xffffffff') {
      (term->curs).y = (term->curs).y + L'\x01';
    }
    (term->curs).x = L'\0';
    term->wrapnext = false;
    register0x00000000 = lineptr(term,(term->curs).y,L'ಧ',L'\x01');
  }
  if (((term->insert & 1U) != 0) && (L'\0' < cursplus.y)) {
    insch(term,cursplus.y);
  }
  if (term->selstate != LEXICOGRAPHIC) {
    _x = term->curs;
    incpos_fn((pos *)&x,term->cols);
    check_selection(term,term->curs,_x);
  }
  if ((((c & 0xffffff00) == 0xd800) || ((c & 0xffffff00) == 0)) &&
     (term->logctx != (LogContext *)0x0)) {
    logtraffic(term->logctx,(uchar)c,1);
  }
  check_trust_status(term,stack0xffffffffffffffe0);
  local_30 = term->cols;
  if ((stack0xffffffffffffffe0->trusted & 1U) != 0) {
    local_30 = local_30 + L'\xfffffffd';
  }
  cline = (termline *)c;
  if ((cursplus.y == L'\x02') && (local_30 < L'\x02')) {
    cursplus.y = L'\x01';
    cline = (termline *)0xfffd;
  }
  if (cursplus.y == L'\0') {
    if (L'\0' < (term->curs).x) {
      wVar1 = (term->curs).x;
      local_34 = wVar1 + L'\xffffffff';
      if ((term->wrapnext & 1U) != 0) {
        local_34 = wVar1;
      }
      if (stack0xffffffffffffffe0->chars[local_34].chr == 0xdfff) {
        if (local_34 < L'\x01') {
          __assert_fail("x > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0xd11,"void term_display_graphic_char(Terminal *, unsigned long)");
        }
        local_34 = local_34 + L'\xffffffff';
      }
      add_cc(stack0xffffffffffffffe0,local_34,(unsigned_long)cline);
      seen_disp_event(term);
    }
  }
  else {
    if (cursplus.y == L'\x01') {
      check_boundary(term,(term->curs).x,(term->curs).y);
      check_boundary(term,(term->curs).x + L'\x01',(term->curs).y);
      clear_cc(stack0xffffffffffffffe0,(term->curs).x);
      stack0xffffffffffffffe0->chars[(term->curs).x].chr = (unsigned_long)cline;
      stack0xffffffffffffffe0->chars[(term->curs).x].attr = (long)term->curr_attr;
      stack0xffffffffffffffe0->chars[(term->curs).x].truecolour = term->curr_truecolour;
    }
    else {
      if (cursplus.y != L'\x02') {
        return;
      }
      check_boundary(term,(term->curs).x,(term->curs).y);
      check_boundary(term,(term->curs).x + L'\x02',(term->curs).y);
      if (local_30 + L'\xffffffff' <= (term->curs).x) {
        copy_termchar(stack0xffffffffffffffe0,(term->curs).x,&term->erase_char);
        stack0xffffffffffffffe0->lattr = stack0xffffffffffffffe0->lattr | 0x30;
        if ((term->curs).y == term->marg_b) {
          scroll(term,term->marg_t,term->marg_b,L'\x01',true);
        }
        else if ((term->curs).y < term->rows + L'\xffffffff') {
          (term->curs).y = (term->curs).y + L'\x01';
        }
        (term->curs).x = L'\0';
        register0x00000000 = lineptr(term,(term->curs).y,L'ೠ',L'\x01');
        check_boundary(term,(term->curs).x,(term->curs).y);
        check_boundary(term,(term->curs).x + L'\x02',(term->curs).y);
      }
      clear_cc(stack0xffffffffffffffe0,(term->curs).x);
      stack0xffffffffffffffe0->chars[(term->curs).x].chr = (unsigned_long)cline;
      stack0xffffffffffffffe0->chars[(term->curs).x].attr = (long)term->curr_attr;
      stack0xffffffffffffffe0->chars[(term->curs).x].truecolour = term->curr_truecolour;
      (term->curs).x = (term->curs).x + L'\x01';
      clear_cc(stack0xffffffffffffffe0,(term->curs).x);
      stack0xffffffffffffffe0->chars[(term->curs).x].chr = 0xdfff;
      stack0xffffffffffffffe0->chars[(term->curs).x].attr = (long)term->curr_attr;
      stack0xffffffffffffffe0->chars[(term->curs).x].truecolour = term->curr_truecolour;
    }
    (term->curs).x = (term->curs).x + L'\x01';
    if (local_30 <= (term->curs).x) {
      (term->curs).x = local_30 + L'\xffffffff';
      term->wrapnext = true;
      if (((term->wrap & 1U) != 0) && ((term->vt52_mode & 1U) != 0)) {
        stack0xffffffffffffffe0->lattr = stack0xffffffffffffffe0->lattr | 0x10;
        if ((term->curs).y == term->marg_b) {
          scroll(term,term->marg_t,term->marg_b,L'\x01',true);
        }
        else if ((term->curs).y < term->rows + L'\xffffffff') {
          (term->curs).y = (term->curs).y + L'\x01';
        }
        (term->curs).x = L'\0';
        term->wrapnext = false;
      }
    }
    seen_disp_event(term);
  }
  return;
}

Assistant:

static void term_display_graphic_char(Terminal *term, unsigned long c)
{
    termline *cline = scrlineptr(term->curs.y);
    int width = 0;
    if (DIRECT_CHAR(c))
        width = 1;
    if (!width)
        width = term_char_width(term, c);

    if (term->wrapnext && term->wrap && width > 0) {
        cline->lattr |= LATTR_WRAPPED;
        if (term->curs.y == term->marg_b)
            scroll(term, term->marg_t, term->marg_b, 1, true);
        else if (term->curs.y < term->rows - 1)
            term->curs.y++;
        term->curs.x = 0;
        term->wrapnext = false;
        cline = scrlineptr(term->curs.y);
    }
    if (term->insert && width > 0)
        insch(term, width);
    if (term->selstate != NO_SELECTION) {
        pos cursplus = term->curs;
        incpos(cursplus);
        check_selection(term, term->curs, cursplus);
    }
    if (((c & CSET_MASK) == CSET_ASCII ||
         (c & CSET_MASK) == 0) && term->logctx)
        logtraffic(term->logctx, (unsigned char) c, LGTYP_ASCII);

    check_trust_status(term, cline);

    int linecols = term->cols;
    if (cline->trusted)
        linecols -= TRUST_SIGIL_WIDTH;

    /*
     * Preliminary check: if the terminal is only one character cell
     * wide, then we cannot display any double-width character at all.
     * Substitute single-width REPLACEMENT CHARACTER instead.
     */
    if (width == 2 && linecols < 2) {
        width = 1;
        c = 0xFFFD;
    }

    switch (width) {
      case 2:
        /*
         * If we're about to display a double-width character starting
         * in the rightmost column, then we do something special
         * instead. We must print a space in the last column of the
         * screen, then wrap; and we also set LATTR_WRAPPED2 which
         * instructs subsequent cut-and-pasting not only to splice
         * this line to the one after it, but to ignore the space in
         * the last character position as well. (Because what was
         * actually output to the terminal was presumably just a
         * sequence of CJK characters, and we don't want a space to be
         * pasted in the middle of those just because they had the
         * misfortune to start in the wrong parity column. xterm
         * concurs.)
         */
        check_boundary(term, term->curs.x, term->curs.y);
        check_boundary(term, term->curs.x+2, term->curs.y);
        if (term->curs.x >= linecols-1) {
            copy_termchar(cline, term->curs.x,
                          &term->erase_char);
            cline->lattr |= LATTR_WRAPPED | LATTR_WRAPPED2;
            if (term->curs.y == term->marg_b)
                scroll(term, term->marg_t, term->marg_b,
                       1, true);
            else if (term->curs.y < term->rows - 1)
                term->curs.y++;
            term->curs.x = 0;
            cline = scrlineptr(term->curs.y);
            /* Now we must check_boundary again, of course. */
            check_boundary(term, term->curs.x, term->curs.y);
            check_boundary(term, term->curs.x+2, term->curs.y);
        }

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = c;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        term->curs.x++;

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = UCSWIDE;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        break;
      case 1:
        check_boundary(term, term->curs.x, term->curs.y);
        check_boundary(term, term->curs.x+1, term->curs.y);

        /* FULL-TERMCHAR */
        clear_cc(cline, term->curs.x);
        cline->chars[term->curs.x].chr = c;
        cline->chars[term->curs.x].attr = term->curr_attr;
        cline->chars[term->curs.x].truecolour =
            term->curr_truecolour;

        break;
      case 0:
        if (term->curs.x > 0) {
            int x = term->curs.x - 1;

            /* If we're in wrapnext state, the character to combine
             * with is _here_, not to our left. */
            if (term->wrapnext)
                x++;

            /*
             * If the previous character is UCSWIDE, back up another
             * one.
             */
            if (cline->chars[x].chr == UCSWIDE) {
                assert(x > 0);
                x--;
            }

            add_cc(cline, x, c);
            seen_disp_event(term);
        }
        return;
      default:
        return;
    }
    term->curs.x++;
    if (term->curs.x >= linecols) {
        term->curs.x = linecols - 1;
        term->wrapnext = true;
        if (term->wrap && term->vt52_mode) {
            cline->lattr |= LATTR_WRAPPED;
            if (term->curs.y == term->marg_b)
                scroll(term, term->marg_t, term->marg_b, 1, true);
            else if (term->curs.y < term->rows - 1)
                term->curs.y++;
            term->curs.x = 0;
            term->wrapnext = false;
        }
    }
    seen_disp_event(term);
}